

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

void __thiscall
cmParseCoberturaCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_85 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTest *ctest_local;
  XMLParser *this_local;
  
  local_20 = (undefined1  [8])cont;
  cont_local = (cmCTestCoverageHandlerContainer *)ctest;
  ctest_local = (cmCTest *)this;
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_017d1838;
  this->InSources = false;
  this->InSource = false;
  this->SkipThisClass = false;
  local_78 = &local_70;
  std::__cxx11::string::string((string *)local_78,(string *)((long)local_20 + 8));
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  std::__cxx11::string::string((string *)local_78,(string *)((long)local_20 + 0x28));
  local_30 = &local_70;
  local_28 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_85);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->FilePaths,__l,local_85);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_85);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_a8 = local_a8 + -1;
    std::__cxx11::string::~string((string *)local_a8);
  } while (local_a8 != &local_70);
  this->CTest = (cmCTest *)cont_local;
  this->Coverage = (cmCTestCoverageHandlerContainer *)local_20;
  std::__cxx11::string::string((string *)&this->CurFileName);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : FilePaths{ cont.SourceDir, cont.BinaryDir }
    , CTest(ctest)
    , Coverage(cont)
  {
  }